

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void test_error_case(void)

{
  mmk_fn fn;
  long lVar1;
  int *piVar2;
  mmk_result local_38;
  undefined8 local_18;
  
  fn = mmk_mock_create_internal("malloc@lib:strdup",mmkuser_malloc_mock_stub,(mmk_mock_options)0x1);
  if (fn == (mmk_fn)0x0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/sample/strdup/test.c"
                ,0x23,"(mmk_fn) mock != MMK_MOCK_INVALID");
    mmk_abort();
  }
  mmk_matcher_init(0);
  local_38.sentinel_ = 0;
  local_38.then_errno = 0xc;
  local_38.then_return = &local_18;
  local_18 = 0;
  local_38.then_call = (_func_void *)0x0;
  local_38.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_38);
  mmk_matcher_add(MMK_MATCHER_ANY,1);
  (*fn)(0);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/sample/strdup/test.c"
                      ,0x27);
  mmk_matcher_term();
  lVar1 = my_strdup("foo");
  if (lVar1 == 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) goto LAB_001024bd;
  }
  mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/sample/strdup/test.c"
              ,0x2a,"dup == NULL && errno == ENOMEM");
  mmk_abort();
LAB_001024bd:
  mmk_reset(fn);
  return;
}

Assistant:

void test_error_case(void)
{
    /* Alternative usage */
    malloc_mock mock = mmk_mock("malloc@lib:strdup", malloc_mock);
    mmk_assert((mmk_fn) mock != MMK_MOCK_INVALID);

    mmk_when(mock(mmk_any(size_t)),
            .then_return = &(void *) { NULL },
            .then_errno = ENOMEM);

    char *dup = my_strdup("foo");
    mmk_assert(dup == NULL && errno == ENOMEM);

    mmk_reset(mock);
}